

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O0

iterator * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::end_related
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *start)

{
  BucketIterator in_RDI;
  _Self endIt;
  EdgeIterator *in_stack_ffffffffffffffb8;
  iterator *piVar1;
  
  piVar1 = (iterator *)in_RDI._M_node;
  getItFor((RelationsGraph<dg::vr::ValueRelations> *)in_RDI._M_node,(Bucket *)in_RDI._M_node);
  std::
  _Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>::
  operator++((_Rb_tree_const_iterator<std::unique_ptr<dg::vr::Bucket,_std::default_delete<dg::vr::Bucket>_>_>
              *)in_RDI._M_node);
  EdgeIterator::EdgeIterator(in_stack_ffffffffffffffb8,in_RDI);
  return piVar1;
}

Assistant:

iterator end_related(const Bucket &start) const {
        auto endIt = ++getItFor(start);
        return iterator(endIt);
    }